

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::Sub::Sub(Sub *this,Token *t,int line)

{
  Token local_50;
  int local_1c;
  Token *pTStack_18;
  int line_local;
  Token *t_local;
  Sub *this_local;
  
  local_1c = line;
  pTStack_18 = t;
  t_local = (Token *)this;
  token::Token::Token(&local_50,t);
  BinaryOp::BinaryOp(&this->super_BinaryOp,&local_50,2,0,local_1c);
  token::Token::~Token(&local_50);
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__Sub_001e1030;
  return;
}

Assistant:

Sub(Token t, int line)
        :BinaryOp(t, PRECENDENCE::SUB, ASSOCIATION::LEFT, line) {}